

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O2

void __thiscall
cmDocumentationFormatter::PrintColumn(cmDocumentationFormatter *this,ostream *os,char *text)

{
  int iVar1;
  byte bVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  bool bVar6;
  char *pcVar7;
  long lVar8;
  bool bVar9;
  
  iVar1 = this->TextWidth;
  sVar3 = strlen(this->TextIndent);
  bVar2 = *text;
  bVar6 = true;
  lVar4 = 0;
  bVar9 = false;
  do {
    if (bVar2 == 0) {
      return;
    }
    lVar8 = 0;
    while ((0x20 < bVar2 || ((0x100000401U >> ((ulong)bVar2 & 0x3f) & 1) == 0))) {
      bVar2 = text[lVar8 + 1];
      lVar8 = lVar8 + 1;
    }
    pcVar7 = text + lVar8;
    if (lVar8 < (long)(((long)iVar1 - (long)(int)sVar3) - ((ulong)bVar9 + lVar4))) {
      if (text < pcVar7) {
        if (lVar4 == 0) {
          pcVar5 = "";
          if (!bVar6) {
            pcVar5 = this->TextIndent;
          }
          std::operator<<(os,pcVar5);
          lVar4 = 0;
        }
        else if (bVar9 == false) {
          std::operator<<(os," ");
          lVar4 = lVar4 + 1;
        }
        else {
          std::operator<<(os,"  ");
          lVar4 = lVar4 + 2;
        }
        std::ostream::write((char *)os,(long)text);
        bVar2 = text[lVar8];
        bVar9 = text[lVar8 + -1] == '.';
      }
      if (bVar2 == 10) {
        std::operator<<(os,"\n");
        pcVar7 = text + lVar8 + 1;
LAB_0036c1b8:
        lVar4 = 0;
        goto LAB_0036c1bb;
      }
      lVar4 = lVar8 + lVar4;
    }
    else {
      std::operator<<(os,"\n");
      if (pcVar7 <= text) goto LAB_0036c1b8;
      std::operator<<(os,this->TextIndent);
      std::ostream::write((char *)os,(long)text);
      bVar9 = text[lVar8 + -1] == '.';
      lVar4 = lVar8;
LAB_0036c1bb:
      bVar6 = false;
    }
    text = pcVar7 + -1;
    do {
      bVar2 = text[1];
      text = text + 1;
    } while (bVar2 == 0x20);
  } while( true );
}

Assistant:

void cmDocumentationFormatter::PrintColumn(std::ostream& os, const char* text)
{
  // Print text arranged in an indented column of fixed witdh.
  const char* l = text;
  long column = 0;
  bool newSentence = false;
  bool firstLine = true;
  int width = this->TextWidth - static_cast<int>(strlen(this->TextIndent));

  // Loop until the end of the text.
  while (*l) {
    // Parse the next word.
    const char* r = l;
    while (*r && (*r != '\n') && (*r != ' ')) {
      ++r;
    }

    // Does it fit on this line?
    if (r - l < (width - column - (newSentence ? 1 : 0))) {
      // Word fits on this line.
      if (r > l) {
        if (column) {
          // Not first word on line.  Separate from the previous word
          // by a space, or two if this is a new sentence.
          if (newSentence) {
            os << "  ";
            column += 2;
          } else {
            os << " ";
            column += 1;
          }
        } else {
          // First word on line.  Print indentation unless this is the
          // first line.
          os << (firstLine ? "" : this->TextIndent);
        }

        // Print the word.
        os.write(l, static_cast<long>(r - l));
        newSentence = (*(r - 1) == '.');
      }

      if (*r == '\n') {
        // Text provided a newline.  Start a new line.
        os << "\n";
        ++r;
        column = 0;
        firstLine = false;
      } else {
        // No provided newline.  Continue this line.
        column += static_cast<long>(r - l);
      }
    } else {
      // Word does not fit on this line.  Start a new line.
      os << "\n";
      firstLine = false;
      if (r > l) {
        os << this->TextIndent;
        os.write(l, static_cast<long>(r - l));
        column = static_cast<long>(r - l);
        newSentence = (*(r - 1) == '.');
      } else {
        column = 0;
      }
    }

    // Move to beginning of next word.  Skip over whitespace.
    l = r;
    while (*l == ' ') {
      ++l;
    }
  }
}